

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

ostream * wasm::operator<<(ostream *o,Literals *literals)

{
  ulong uVar1;
  Literals *pLVar2;
  size_t sVar3;
  Literal *pLVar4;
  ostream *o_00;
  Literal local_80;
  ulong local_68;
  size_t i;
  Literal local_38;
  Literals *local_20;
  Literals *literals_local;
  ostream *o_local;
  
  local_20 = literals;
  literals_local = (Literals *)o;
  sVar3 = SmallVector<wasm::Literal,_1UL>::size(&literals->super_SmallVector<wasm::Literal,_1UL>);
  pLVar2 = literals_local;
  if (sVar3 == 1) {
    pLVar4 = SmallVector<wasm::Literal,_1UL>::operator[]
                       (&literals->super_SmallVector<wasm::Literal,_1UL>,0);
    Literal::Literal(&local_38,pLVar4);
    o_local = operator<<((ostream *)pLVar2,&local_38);
    Literal::~Literal(&local_38);
  }
  else {
    std::operator<<((ostream *)literals_local,'(');
    sVar3 = SmallVector<wasm::Literal,_1UL>::size(&literals->super_SmallVector<wasm::Literal,_1UL>);
    pLVar2 = literals_local;
    if (sVar3 != 0) {
      pLVar4 = SmallVector<wasm::Literal,_1UL>::operator[]
                         (&literals->super_SmallVector<wasm::Literal,_1UL>,0);
      Literal::Literal((Literal *)&i,pLVar4);
      operator<<((ostream *)pLVar2,(Literal *)&i);
      Literal::~Literal((Literal *)&i);
    }
    local_68 = 1;
    while( true ) {
      uVar1 = local_68;
      sVar3 = SmallVector<wasm::Literal,_1UL>::size
                        (&literals->super_SmallVector<wasm::Literal,_1UL>);
      if (sVar3 <= uVar1) break;
      o_00 = std::operator<<((ostream *)literals_local,", ");
      pLVar4 = SmallVector<wasm::Literal,_1UL>::operator[]
                         (&literals->super_SmallVector<wasm::Literal,_1UL>,local_68);
      Literal::Literal(&local_80,pLVar4);
      operator<<(o_00,&local_80);
      Literal::~Literal(&local_80);
      local_68 = local_68 + 1;
    }
    o_local = std::operator<<((ostream *)literals_local,')');
  }
  return o_local;
}

Assistant:

std::ostream& operator<<(std::ostream& o, wasm::Literals literals) {
  if (literals.size() == 1) {
    return o << literals[0];
  } else {
    o << '(';
    if (literals.size() > 0) {
      o << literals[0];
    }
    for (size_t i = 1; i < literals.size(); ++i) {
      o << ", " << literals[i];
    }
    return o << ')';
  }
}